

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsort_impl.h
# Opt level: O3

void secp256k1_heap_down(uchar *arr,size_t i,size_t heap_size,size_t stride,
                        _func_int_void_ptr_void_ptr_void_ptr *cmp,void *cmp_data)

{
  byte *pbVar1;
  long lVar2;
  byte bVar3;
  char cVar4;
  uchar *puVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  uint64_t uVar13;
  uint64_t uVar14;
  uint64_t uVar15;
  uint64_t uVar16;
  uint64_t uVar17;
  uint64_t uVar18;
  uint64_t uVar19;
  _func_int_void_ptr_void_ptr_void_ptr *p_Var20;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  byte *pbVar24;
  byte *extraout_RDX;
  uchar *sigend;
  secp256k1_scalar *unaff_RBX;
  uchar *b_1;
  long lVar25;
  uint64_t *puVar26;
  secp256k1_scalar *sigp;
  char *__src;
  uint uVar27;
  ulong uVar28;
  uchar *b;
  long lVar29;
  uchar *unaff_R14;
  uchar *a;
  ulong unaff_R15;
  long lVar30;
  uchar tmp [64];
  int iStack_124;
  ulong uStack_120;
  uchar auStack_118 [40];
  secp256k1_scalar *psStack_f0;
  uchar *puStack_e8;
  size_t sStack_e0;
  code *pcStack_d8;
  code *pcStack_d0;
  uchar *local_c0;
  uchar *local_b8;
  size_t local_b0;
  _func_int_void_ptr_void_ptr_void_ptr *local_a8;
  void *local_a0;
  secp256k1_scalar local_98;
  uint64_t local_78;
  uint64_t uStack_70;
  uint64_t local_68;
  uint64_t uStack_60;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_48 = heap_size >> 1;
  if (i < local_48) {
    local_b8 = arr + -0x40;
    sigp = (secp256k1_scalar *)i;
    local_c0 = arr;
    local_b0 = stride;
    local_a8 = cmp;
    local_a0 = cmp_data;
    local_40 = heap_size;
    do {
      p_Var20 = local_a8;
      puVar5 = local_c0;
      uVar22 = i * 2 + 1;
      if (local_40 <= uVar22) {
        pcStack_d0 = secp256k1_der_read_len;
        secp256k1_heap_down_cold_1();
        if ((secp256k1_scalar *)arr != (secp256k1_scalar *)0x0) {
          ((secp256k1_scalar *)arr)->d[0] = 0;
          pbVar24 = (byte *)sigp->d[0];
          if (pbVar24 < extraout_RDX) {
            pbVar1 = pbVar24 + 1;
            sigp->d[0] = (uint64_t)pbVar1;
            bVar3 = *pbVar24;
            if ((ulong)bVar3 != 0xff) {
              if ((char)bVar3 < '\0') {
                if (bVar3 != 0x80) {
                  uVar27 = bVar3 & 0x7f;
                  uVar22 = (ulong)uVar27;
                  if ((((uVar22 <= (ulong)((long)extraout_RDX - (long)pbVar1)) && ((byte)uVar27 < 9)
                       ) && (*pbVar1 != 0)) && (uVar22 != 0)) {
                    pbVar24 = pbVar24 + 2;
                    uVar23 = 0;
                    uVar28 = 0;
                    do {
                      uVar28 = (ulong)pbVar24[-1] | uVar28 << 8;
                      ((secp256k1_scalar *)arr)->d[0] = uVar28;
                      sigp->d[0] = (uint64_t)pbVar24;
                      pbVar24 = pbVar24 + 1;
                      uVar23 = uVar23 + 1;
                    } while (uVar22 != uVar23);
                  }
                }
              }
              else {
                ((secp256k1_scalar *)arr)->d[0] = (ulong)bVar3;
              }
            }
          }
          return;
        }
        pcStack_d8 = secp256k1_der_parse_integer;
        secp256k1_der_read_len_cold_1();
        iStack_124 = 0;
        auStack_118[0x10] = '\0';
        auStack_118[0x11] = '\0';
        auStack_118[0x12] = '\0';
        auStack_118[0x13] = '\0';
        auStack_118[0x14] = '\0';
        auStack_118[0x15] = '\0';
        auStack_118[0x16] = '\0';
        auStack_118[0x17] = '\0';
        auStack_118[0x18] = '\0';
        auStack_118[0x19] = '\0';
        auStack_118[0x1a] = '\0';
        auStack_118[0x1b] = '\0';
        auStack_118[0x1c] = '\0';
        auStack_118[0x1d] = '\0';
        auStack_118[0x1e] = '\0';
        auStack_118[0x1f] = '\0';
        auStack_118[0] = '\0';
        auStack_118[1] = '\0';
        auStack_118[2] = '\0';
        auStack_118[3] = '\0';
        auStack_118[4] = '\0';
        auStack_118[5] = '\0';
        auStack_118[6] = '\0';
        auStack_118[7] = '\0';
        auStack_118[8] = '\0';
        auStack_118[9] = '\0';
        auStack_118[10] = '\0';
        auStack_118[0xb] = '\0';
        auStack_118[0xc] = '\0';
        auStack_118[0xd] = '\0';
        auStack_118[0xe] = '\0';
        auStack_118[0xf] = '\0';
        puVar5 = (uchar *)sigp->d[0];
        if (puVar5 == sigend) {
          return;
        }
        if (*puVar5 != '\x02') {
          return;
        }
        sigp->d[0] = (uint64_t)(puVar5 + 1);
        psStack_f0 = unaff_RBX;
        puStack_e8 = unaff_R14;
        sStack_e0 = unaff_R15;
        pcStack_d8 = (code *)i;
        iVar21 = secp256k1_der_read_len(&uStack_120,(uchar **)sigp,sigend);
        if (iVar21 == 0) {
          return;
        }
        if (uStack_120 == 0) {
          return;
        }
        __src = (char *)sigp->d[0];
        if ((ulong)((long)sigend - (long)__src) < uStack_120) {
          return;
        }
        cVar4 = *__src;
        if (uStack_120 == 1 || cVar4 != '\0') {
          if (cVar4 == -1 && uStack_120 != 1) {
            if (__src[1] < '\0') {
              return;
            }
          }
          else if (-1 < cVar4) {
            if (cVar4 == '\0') goto LAB_001400e9;
            goto LAB_001400f7;
          }
          iStack_124 = 1;
          if (0x20 < uStack_120) goto LAB_0014013e;
        }
        else {
          if (-1 < __src[1]) {
            return;
          }
LAB_001400e9:
          uStack_120 = uStack_120 - 1;
          __src = __src + 1;
          sigp->d[0] = (uint64_t)__src;
LAB_001400f7:
          if (uStack_120 < 0x21) {
            if (uStack_120 != 0) {
              memcpy(auStack_118 + (0x20 - uStack_120),__src,uStack_120);
            }
            secp256k1_scalar_set_b32((secp256k1_scalar *)arr,auStack_118,&iStack_124);
            if (iStack_124 == 0) goto LAB_0014015a;
          }
          else {
LAB_0014013e:
            iStack_124 = 1;
          }
        }
        ((secp256k1_scalar *)arr)->d[2] = 0;
        ((secp256k1_scalar *)arr)->d[3] = 0;
        ((secp256k1_scalar *)arr)->d[0] = 0;
        ((secp256k1_scalar *)arr)->d[1] = 0;
        secp256k1_scalar_verify((secp256k1_scalar *)arr);
LAB_0014015a:
        sigp->d[0] = sigp->d[0] + uStack_120;
        return;
      }
      uVar23 = i * 2 + 2;
      local_38 = uVar22;
      if (uVar23 < local_40) {
        arr = local_c0 + uVar23 * stride;
        lVar29 = uVar22 * local_b0;
        pcStack_d0 = (code *)0x13fd06;
        local_50 = uVar23;
        iVar21 = (*local_a8)(arr,local_c0 + lVar29,local_a0);
        stride = local_b0;
        if (iVar21 < 0) goto LAB_0013fe4e;
        unaff_R14 = puVar5 + i * local_b0;
        pcStack_d0 = (code *)0x13fd33;
        iVar21 = (*p_Var20)(arr,unaff_R14,local_a0);
        if (iVar21 < 1) {
          return;
        }
        unaff_R15 = stride;
        if (0x40 < stride) {
          lVar29 = (i * 2 + 3) * stride;
          lVar25 = (i + 1) * stride;
          lVar30 = 0;
          do {
            local_98.d[0] = *(uint64_t *)(local_b8 + lVar30 + lVar25);
            local_98.d[1] = *(uint64_t *)((long)(local_b8 + lVar30 + lVar25) + 8);
            local_98.d[2] = *(uint64_t *)(local_b8 + lVar30 + lVar25 + 0x10);
            local_98.d[3] = *(uint64_t *)((long)(local_b8 + lVar30 + lVar25 + 0x10) + 8);
            local_78 = *(uint64_t *)(local_b8 + lVar30 + lVar25 + 0x20);
            uStack_70 = *(uint64_t *)((long)(local_b8 + lVar30 + lVar25 + 0x20) + 8);
            local_68 = *(uint64_t *)(local_b8 + lVar30 + lVar25 + 0x30);
            uStack_60 = *(uint64_t *)((long)(local_b8 + lVar30 + lVar25 + 0x30) + 8);
            uVar6 = *(undefined8 *)(local_b8 + lVar30 + lVar29 + 8);
            uVar7 = *(undefined8 *)(local_b8 + lVar30 + lVar29 + 0x10);
            uVar8 = *(undefined8 *)(local_b8 + lVar30 + lVar29 + 0x10 + 8);
            uVar9 = *(undefined8 *)(local_b8 + lVar30 + lVar29 + 0x20);
            uVar10 = *(undefined8 *)(local_b8 + lVar30 + lVar29 + 0x20 + 8);
            uVar11 = *(undefined8 *)(local_b8 + lVar30 + lVar29 + 0x30);
            uVar12 = *(undefined8 *)(local_b8 + lVar30 + lVar29 + 0x30 + 8);
            *(undefined8 *)(local_b8 + lVar30 + lVar25) =
                 *(undefined8 *)(local_b8 + lVar30 + lVar29);
            *(undefined8 *)(local_b8 + lVar30 + lVar25 + 8) = uVar6;
            *(undefined8 *)(local_b8 + lVar30 + lVar25 + 0x30) = uVar11;
            *(undefined8 *)(local_b8 + lVar30 + lVar25 + 0x30 + 8) = uVar12;
            *(undefined8 *)(local_b8 + lVar30 + lVar25 + 0x20) = uVar9;
            *(undefined8 *)(local_b8 + lVar30 + lVar25 + 0x20 + 8) = uVar10;
            *(undefined8 *)(local_b8 + lVar30 + lVar25 + 0x10) = uVar7;
            *(undefined8 *)(local_b8 + lVar30 + lVar25 + 0x10 + 8) = uVar8;
            *(uint64_t *)(local_b8 + lVar30 + lVar29 + 0x30) = local_68;
            *(uint64_t *)((long)(local_b8 + lVar30 + lVar29 + 0x30) + 8) = uStack_60;
            *(uint64_t *)(local_b8 + lVar30 + lVar29 + 0x20) = local_78;
            *(uint64_t *)((long)(local_b8 + lVar30 + lVar29 + 0x20) + 8) = uStack_70;
            *(uint64_t *)(local_b8 + lVar30 + lVar29 + 0x10) = local_98.d[2];
            *(uint64_t *)((long)(local_b8 + lVar30 + lVar29 + 0x10) + 8) = local_98.d[3];
            *(uint64_t *)(local_b8 + lVar30 + lVar29) = local_98.d[0];
            *(uint64_t *)((long)(local_b8 + lVar30 + lVar29) + 8) = local_98.d[1];
            lVar2 = stride + lVar30;
            lVar30 = lVar30 + -0x40;
          } while (0x40 < lVar2 - 0x40U);
          unaff_R15 = lVar30 + stride;
        }
        unaff_RBX = &local_98;
        pcStack_d0 = (code *)0x13fe1a;
        memcpy(unaff_RBX,unaff_R14,unaff_R15);
        pcStack_d0 = (code *)0x13fe28;
        memmove(unaff_R14,arr,unaff_R15);
        pcStack_d0 = (code *)0x13fe36;
        sigp = unaff_RBX;
        memcpy(arr,unaff_RBX,unaff_R15);
        i = local_50;
      }
      else {
        lVar29 = uVar22 * stride;
LAB_0013fe4e:
        unaff_RBX = (secp256k1_scalar *)(puVar5 + lVar29);
        unaff_R14 = puVar5 + i * stride;
        pcStack_d0 = (code *)0x13fe67;
        iVar21 = (*p_Var20)(unaff_RBX,unaff_R14,local_a0);
        if (iVar21 < 1) {
          return;
        }
        unaff_R15 = stride;
        if (0x40 < stride) {
          puVar26 = (uint64_t *)(local_b8 + (i + 1) * stride);
          uVar22 = stride;
          do {
            unaff_R15 = uVar22 - 0x40;
            local_98.d[0] = *puVar26;
            local_98.d[1] = puVar26[1];
            local_98.d[2] = puVar26[2];
            local_98.d[3] = puVar26[3];
            local_78 = puVar26[4];
            uStack_70 = puVar26[5];
            local_68 = puVar26[6];
            uStack_60 = puVar26[7];
            uVar13 = *(uint64_t *)((long)(local_b8 + uVar22 + lVar29) + 8);
            uVar14 = *(uint64_t *)(local_b8 + uVar22 + lVar29 + 0x10);
            uVar15 = *(uint64_t *)((long)(local_b8 + uVar22 + lVar29 + 0x10) + 8);
            uVar16 = *(uint64_t *)(local_b8 + uVar22 + lVar29 + 0x20);
            uVar17 = *(uint64_t *)((long)(local_b8 + uVar22 + lVar29 + 0x20) + 8);
            uVar18 = *(uint64_t *)(local_b8 + uVar22 + lVar29 + 0x30);
            uVar19 = *(uint64_t *)((long)(local_b8 + uVar22 + lVar29 + 0x30) + 8);
            *puVar26 = *(uint64_t *)(local_b8 + uVar22 + lVar29);
            puVar26[1] = uVar13;
            puVar26[6] = uVar18;
            puVar26[7] = uVar19;
            puVar26[4] = uVar16;
            puVar26[5] = uVar17;
            puVar26[2] = uVar14;
            puVar26[3] = uVar15;
            *(uint64_t *)(local_b8 + uVar22 + lVar29 + 0x30) = local_68;
            *(uint64_t *)((long)(local_b8 + uVar22 + lVar29 + 0x30) + 8) = uStack_60;
            *(uint64_t *)(local_b8 + uVar22 + lVar29 + 0x20) = local_78;
            *(uint64_t *)((long)(local_b8 + uVar22 + lVar29 + 0x20) + 8) = uStack_70;
            *(uint64_t *)(local_b8 + uVar22 + lVar29 + 0x10) = local_98.d[2];
            *(uint64_t *)((long)(local_b8 + uVar22 + lVar29 + 0x10) + 8) = local_98.d[3];
            *(uint64_t *)(local_b8 + uVar22 + lVar29) = local_98.d[0];
            *(uint64_t *)((long)(local_b8 + uVar22 + lVar29) + 8) = local_98.d[1];
            puVar26 = puVar26 + -8;
            uVar22 = unaff_R15;
          } while (0x40 < unaff_R15);
        }
        sigp = &local_98;
        pcStack_d0 = (code *)0x13ff31;
        memcpy(sigp,unaff_R14,unaff_R15);
        pcStack_d0 = (code *)0x13ff3f;
        memmove(unaff_R14,unaff_RBX,unaff_R15);
        pcStack_d0 = (code *)0x13ff4d;
        arr = (uchar *)unaff_RBX;
        memcpy(unaff_RBX,sigp,unaff_R15);
        i = local_38;
      }
    } while (i < local_48);
  }
  return;
}

Assistant:

static SECP256K1_INLINE void secp256k1_heap_down(unsigned char *arr, size_t i, size_t heap_size, size_t stride,
                            int (*cmp)(const void *, const void *, void *), void *cmp_data) {
    while (i < heap_size/2) {
        VERIFY_CHECK(i <= SIZE_MAX/2 - 1);
        /* Proof:
         * i < heap_size/2
         * i + 1 <= heap_size/2
         * 2*i + 2 <= heap_size <= SIZE_MAX
         * 2*i <= SIZE_MAX - 2
         */

        VERIFY_CHECK(secp256k1_heap_child1(i) < heap_size);
        /* Proof:
         * i < heap_size/2
         * i + 1 <= heap_size/2
         * 2*i + 2 <= heap_size
         * 2*i + 1 < heap_size
         * child1(i) < heap_size
         */

        /* Let [x] be notation for the contents at arr[x*stride].
         *
         * If [child1(i)] > [i] and [child2(i)] > [i],
         *   swap [i] with the larger child to ensure the new parent is larger
         *   than both children. When [child1(i)] == [child2(i)], swap [i] with
         *   [child2(i)].
         * Else if [child1(i)] > [i], swap [i] with [child1(i)].
         * Else if [child2(i)] > [i], swap [i] with [child2(i)].
         */
        if (secp256k1_heap_child2(i) < heap_size
                && 0 <= cmp(arr + secp256k1_heap_child2(i)*stride, arr + secp256k1_heap_child1(i)*stride, cmp_data)) {
            if (0 < cmp(arr + secp256k1_heap_child2(i)*stride, arr + i*stride, cmp_data)) {
                secp256k1_heap_swap(arr, i, secp256k1_heap_child2(i), stride);
                i = secp256k1_heap_child2(i);
            } else {
                /* At this point we have [child2(i)] >= [child1(i)] and we have
                 * [child2(i)] <= [i], and thus [child1(i)] <= [i] which means
                 * that the next comparison can be skipped. */
                return;
            }
        } else if (0 < cmp(arr + secp256k1_heap_child1(i)*stride, arr +         i*stride, cmp_data)) {
            secp256k1_heap_swap(arr, i, secp256k1_heap_child1(i), stride);
            i = secp256k1_heap_child1(i);
        } else {
            return;
        }
    }
    /* heap_size/2 <= i
     * heap_size/2 < i + 1
     * heap_size < 2*i + 2
     * heap_size <= 2*i + 1
     * heap_size <= child1(i)
     * Thus child1(i) and child2(i) are now out of bounds and we are at a leaf.
     */
}